

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O2

bool __thiscall BamTools::Variant::is_type<signed_char>(Variant *this)

{
  bool bVar1;
  
  if (this->data != (ImplBase *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)this->data->_vptr_ImplBase[-1],
                       (type_info *)&Impl<signed_char>::typeinfo);
    return bVar1;
  }
  __cxa_bad_typeid();
}

Assistant:

bool is_type() const
    {
        return typeid(*data) == typeid(Impl<T>);
    }